

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O2

void test_delimiters_5(void)

{
  run("delimiters set in a parent template should not affect a partial",
      "[ {{>include}} ]\n{{= | | =}}\n[ |>include| ]\n","{\"value\": \"yes\"}",
      "{\"include\": \".{{value}}.\"}","[ .yes. ]\n[ .yes. ]\n");
  return;
}

Assistant:

static void
test_delimiters_5(void)
{
    run(
        "delimiters set in a parent template should not affect a partial",
        "[ {{>include}} ]\n{{= | | =}}\n[ |>include| ]\n",
        "{\"value\": \"yes\"}",
        "{\"include\": \".{{value}}.\"}",
        "[ .yes. ]\n[ .yes. ]\n"
    );
}